

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

AssertionResult
testing::internal::DoubleNearPredFormat
          (char *expr1,char *expr2,char *abs_error_expr,double val1,double val2,double abs_error)

{
  AssertionResult *pAVar1;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  AssertionResult *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  AssertionResult AVar2;
  double diff;
  char *local_58;
  char *local_50;
  char *local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  AssertionResult local_20;
  
  local_40 = ABS(in_XMM0_Qa - in_XMM1_Qa);
  if (local_40 <= in_XMM2_Qa) {
    in_RDI->success_ = true;
    (in_RDI->message_).ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    local_20.success_ = false;
    local_20.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pAVar1 = AssertionResult::operator<<(&local_20,(char (*) [24])"The difference between ");
    pAVar1 = AssertionResult::operator<<(pAVar1,&local_48);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [6])" and ");
    pAVar1 = AssertionResult::operator<<(pAVar1,&local_50);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [5])" is ");
    pAVar1 = AssertionResult::operator<<(pAVar1,&local_40);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [17])", which exceeds ");
    pAVar1 = AssertionResult::operator<<(pAVar1,&local_58);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [9])", where\n");
    pAVar1 = AssertionResult::operator<<(pAVar1,&local_48);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [15])" evaluates to ");
    pAVar1 = AssertionResult::operator<<(pAVar1,&local_28);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [3])",\n");
    pAVar1 = AssertionResult::operator<<(pAVar1,&local_50);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [15])" evaluates to ");
    pAVar1 = AssertionResult::operator<<(pAVar1,&local_30);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [7])", and\n");
    pAVar1 = AssertionResult::operator<<(pAVar1,&local_58);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [15])" evaluates to ");
    pAVar1 = AssertionResult::operator<<(pAVar1,&local_38);
    pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [2])0x1397a7);
    AssertionResult::AssertionResult(in_RDI,pAVar1);
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&local_20.message_);
    in_RDX.ptr_ = extraout_RDX;
  }
  AVar2.message_.ptr_ = in_RDX.ptr_;
  AVar2._0_8_ = in_RDI;
  return AVar2;
}

Assistant:

AssertionResult DoubleNearPredFormat(const char* expr1,
                                     const char* expr2,
                                     const char* abs_error_expr,
                                     double val1,
                                     double val2,
                                     double abs_error) {
  const double diff = fabs(val1 - val2);
  if (diff <= abs_error) return AssertionSuccess();

  // TODO(wan): do not print the value of an expression if it's
  // already a literal.
  return AssertionFailure()
      << "The difference between " << expr1 << " and " << expr2
      << " is " << diff << ", which exceeds " << abs_error_expr << ", where\n"
      << expr1 << " evaluates to " << val1 << ",\n"
      << expr2 << " evaluates to " << val2 << ", and\n"
      << abs_error_expr << " evaluates to " << abs_error << ".";
}